

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O3

bool __thiscall SocketInternals::ExtractInterfaceInfo(SocketInternals *this,MsgHeaderType *hdr)

{
  ostream *poVar1;
  int iVar2;
  cmsghdr *__cmsg;
  char *pcVar3;
  int *piVar4;
  size_t sVar5;
  uint __ifindex;
  bool bVar6;
  ifreq ifr;
  char ifName [256];
  char local_158 [16];
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  char local_128 [264];
  
  this->InterfaceIndex = -1;
  __ifindex = 0xffffffff;
  if ((0xf < hdr->msg_controllen) &&
     (__cmsg = (cmsghdr *)hdr->msg_control, __cmsg != (cmsghdr *)0x0)) {
    do {
      if ((__cmsg->cmsg_level == 0) && (__cmsg->cmsg_type == 8)) {
        this->InterfaceIndex = (int)__cmsg[1].cmsg_len;
      }
      __cmsg = __cmsg_nxthdr((msghdr *)hdr,__cmsg);
    } while (__cmsg != (cmsghdr *)0x0);
    __ifindex = this->InterfaceIndex;
  }
  pcVar3 = if_indextoname(__ifindex,local_128);
  if (pcVar3 == (char *)0x0) {
    poVar1 = this->outStr;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Recv: failed if_indextoname: ",0x1d);
    piVar4 = __errno_location();
    pcVar3 = strerror(*piVar4);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
    }
    else {
      sVar5 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    bVar6 = false;
  }
  else {
    pcVar3 = (char *)(this->InterfaceName)._M_string_length;
    strlen(local_128);
    std::__cxx11::string::_M_replace((ulong)&this->InterfaceName,0,pcVar3,(ulong)local_128);
    local_148 = 0;
    uStack_140 = 0;
    local_158[0] = '\0';
    local_158[1] = '\0';
    local_158[2] = '\0';
    local_158[3] = '\0';
    local_158[4] = '\0';
    local_158[5] = '\0';
    local_158[6] = '\0';
    local_158[7] = '\0';
    local_158[8] = '\0';
    local_158[9] = '\0';
    local_158[10] = '\0';
    local_158[0xb] = '\0';
    local_158[0xc] = '\0';
    local_158[0xd] = '\0';
    local_158[0xe] = '\0';
    local_158[0xf] = '\0';
    local_138 = 0;
    strcpy(local_158,(this->InterfaceName)._M_dataplus._M_p);
    iVar2 = ioctl(this->SocketFD,0x8921,local_158);
    bVar6 = iVar2 == 0;
    if (bVar6) {
      this->InterfaceMTU = (int)local_148;
    }
  }
  return bVar6;
}

Assistant:

bool SocketInternals::ExtractInterfaceInfo(MsgHeaderType *hdr)
{
    InterfaceIndex = -1;
    // iterate through all the control headers
    for (CMsgHdrType * cmsg = CMSG_FIRSTHDR(hdr);
         cmsg != NULL;
         cmsg = CMSG_NXTHDR(hdr, cmsg)) {
        // ignore the control headers that don't match what we want
        if (cmsg->cmsg_level != IPPROTO_IP ||
            cmsg->cmsg_type != IP_PKTINFO) {
            continue;
        }
        // struct in_pktinfo * pi = CMSG_DATA(cmsg)->ipi;
        // at this point, peeraddr is the source sockaddr
        // pi->ipi_spec_dst is the destination in_addr
        InterfaceIndex = ((struct in_pktinfo*)CMSG_DATA(cmsg))->ipi_ifindex;
    }

    // should check if index != -1

#ifdef _MSC_VER
    // Windows supports if_indextoname, but the name returned does not appear to be
    // meaningful. Also, Windows does not appear to support ioctl (or WSAIoctl) to
    // query the MTU value. Thus, we instead use GetAdaptersAddresses, which gives us
    // both the InterfaceName and InterfaceMTU for the specified InterfaceIndex.
    //
    // We first call GetAdaptersAddresses with a null buffer to query the required buffer size.
    PIP_ADAPTER_ADDRESSES addrList = 0;
    ULONG bufSize = 0;
    ULONG retval;
    retval = GetAdaptersAddresses(AF_INET, GAA_FLAG_SKIP_MULTICAST | GAA_FLAG_SKIP_DNS_SERVER,
                                  NULL, addrList, &bufSize);
    if (retval != ERROR_BUFFER_OVERFLOW) {
        outStr << "Recv: GetAdaptersAddresses failed to return buffer size" << std::endl;
        return false;
    }
    // Now, bufSize indicates the correct buffer size. Allocate memory and then call
    // GetAdaptersAddresses again to get the information.
    char *buffer = new char[bufSize];
    addrList = reinterpret_cast<PIP_ADAPTER_ADDRESSES>(buffer);
    retval = GetAdaptersAddresses(AF_INET, GAA_FLAG_SKIP_MULTICAST | GAA_FLAG_SKIP_DNS_SERVER,
                                  NULL, addrList, &bufSize);
    if (retval == NO_ERROR) {
        for (PIP_ADAPTER_ADDRESSES addr = addrList;  addr != 0; addr = addr->Next) {
            if (addr->IfIndex == InterfaceIndex) {
                char fname[256];  // Should be large enough
                if (WideCharToMultiByte(CP_ACP, 0, addr->FriendlyName, -1, fname, sizeof(fname), NULL, NULL) > 0) {
                        InterfaceName = fname;
                        InterfaceMTU = addr->Mtu;
                        break;
                }
            }
        }
    }
    delete [] buffer;
#else
    // get interface name and MTU
    char ifName[256];
    if (if_indextoname(InterfaceIndex, ifName) == NULL) {
        outStr << "Recv: failed if_indextoname: " << strerror(errno) << std::endl;
        return false;
    }
    InterfaceName = ifName;

    struct ifreq ifr;
    memset(&ifr, 0, sizeof(ifr));
    strcpy(ifr.ifr_name, InterfaceName.c_str());
    if (!ioctl(SocketFD, SIOCGIFMTU, &ifr)) {
        InterfaceMTU = ifr.ifr_mtu;
        return true;
    }
#endif
    return false;
}